

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioCtl.cc
# Opt level: O1

void __thiscall AudioCtl::AudioCtl(AudioCtl *this,ProjectSettings *settings)

{
  this->settings_ = &settings->audio;
  this->muted_ = false;
  (this->pos_).super___atomic_base<int>._M_i = 0;
  this->paused_ = false;
  this->start_ = 0;
  this->end_ = (settings->audio).samples;
  this->set_ = 0;
  aAppDebugPrintf("float t = s / %f;",
                  (double)((float)(settings->audio).channels *
                          (float)(settings->audio).samples_per_row * 4.0));
  audioOpen(this->settings_->samplerate,this->settings_->channels,this,audioCallback,(char *)0x0,
            (midi_callback_f)0x0);
  return;
}

Assistant:

AudioCtl::AudioCtl(const ProjectSettings& settings) noexcept
	: settings_(settings.audio)
	, end_(settings_.samples) {
	MSG("float t = s / %f;", (float)settings_.samples_per_row * sizeof(float) * settings_.channels);
	audioOpen(settings_.samplerate, settings_.channels, this, audioCallback, nullptr, nullptr);
}